

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::find_common<1>(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  utf8_ptr *match_len_00;
  int *match_idx_00;
  vm_val_t *pvVar4;
  char *pcVar5;
  size_t sVar6;
  utf8_ptr *this;
  uint *in_RCX;
  long in_RDX;
  vm_val_t *in_RDI;
  int match_len;
  int match_idx;
  int32_t i;
  size_t min_len;
  utf8_ptr strp;
  int32_t start_idx;
  CVmObjPattern *pat2;
  char *str2;
  vm_val_t *val2;
  char *basestr;
  size_t len;
  uint orig_argc;
  vm_val_t *in_stack_ffffffffffffff48;
  vm_val_t *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  int local_98;
  uint n;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  utf8_ptr *in_stack_ffffffffffffff80;
  utf8_ptr in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  CVmObject *strval;
  
  if (in_RCX == (uint *)0x0) {
    n = 0;
  }
  else {
    n = *in_RCX;
  }
  uVar7 = n;
  if ((find_common<1>(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&find_common<1>(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&find_common<1>::desc,1,1);
    __cxa_guard_release(&find_common<1>(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                     &in_stack_ffffffffffffff50->typ,(CVmNativeCodeDesc *)in_stack_ffffffffffffff48)
  ;
  if (iVar2 != 0) {
    return 1;
  }
  match_len_00 = (utf8_ptr *)vmb_get_len((char *)0x395de0);
  match_idx_00 = (int *)(in_RDX + 2);
  pvVar4 = CVmStack::get(0);
  pcVar5 = vm_val_t::get_as_string(in_stack_ffffffffffffff48);
  strval = (CVmObject *)0x0;
  if (pcVar5 == (char *)0x0) {
    if ((pvVar4->typ != VM_OBJ) || (iVar2 = CVmObjPattern::is_pattern_obj(0), iVar2 == 0)) {
      err_throw(0);
    }
    strval = vm_objp(0);
  }
  local_98 = 0;
  if ((1 < n) && (pvVar4 = CVmStack::get(1), pvVar4->typ != VM_NIL)) {
    CVmStack::get(1);
    iVar3 = vm_val_t::num_to_int(in_stack_ffffffffffffff50);
    utf8_ptr::utf8_ptr((utf8_ptr *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    if (iVar3 < 0) {
      sVar6 = utf8_ptr::len((utf8_ptr *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48)
      ;
      local_98 = (int)sVar6;
    }
    else {
      local_98 = -1;
    }
    local_98 = local_98 + iVar3;
    if (pcVar5 == (char *)0x0) {
      this = (utf8_ptr *)0x0;
    }
    else {
      this = (utf8_ptr *)vmb_get_len((char *)0x395f34);
    }
    in_stack_ffffffffffffff7c = 0;
    in_stack_ffffffffffffff80 = this;
    while (bVar1 = in_stack_ffffffffffffff7c < local_98,
          bVar1 && in_stack_ffffffffffffff80 < match_len_00) {
      in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1;
      utf8_ptr::inc(this,(size_t *)
                         CONCAT17(bVar1 && in_stack_ffffffffffffff80 < match_len_00,
                                  in_stack_ffffffffffffff58));
    }
    if (in_stack_ffffffffffffff7c < local_98) {
      vm_val_t::set_nil(in_RDI);
      goto LAB_00396088;
    }
    utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffff88);
  }
  pcVar5 = find_substr((vm_val_t *)strval,(char *)CONCAT44(local_98,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88.p_,(size_t)in_stack_ffffffffffffff80,
                       (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (CVmObjPattern *)CONCAT44(in_stack_ffffffffffffff74,uVar7),match_idx_00,
                       (int *)match_len_00);
  if (pcVar5 == (char *)0x0) {
    vm_val_t::set_nil(in_RDI);
  }
  else {
    vm_val_t::set_int(in_RDI,local_98 + in_stack_ffffffffffffff78 + 1);
  }
LAB_00396088:
  CVmStack::discard(n);
  return 1;
}

Assistant:

inline int CVmObjString::find_common(
    VMG_ vm_val_t *retval,
    const vm_val_t *self_val, const char *str,
    uint *argc)
{
    /* check arguments */
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember where the base string strings */
    const char *basestr = str;

    /* retrieve the string or regex pattern to find */
    vm_val_t *val2 = G_stk->get(0);
    const char *str2 = val2->get_as_string(vmg0_);
    CVmObjPattern *pat2 = 0;
    if (str2 != 0)
    {
        /* we have a simple string to find */
    }
    else if (val2->typ == VM_OBJ
             && CVmObjPattern::is_pattern_obj(vmg_ val2->val.obj))
    {
        /* it's a pattern */
        pat2 = (CVmObjPattern *)vm_objp(vmg_ val2->val.obj);
    }
    else
    {
        /* we need a string or a pattern; other values are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* if there's a starting index, skip that many characters */
    int32_t start_idx = 0;
    if (orig_argc >= 2 && G_stk->get(1)->typ != VM_NIL)
    {
        /* get the starting index value */
        start_idx = G_stk->get(1)->num_to_int(vmg0_);

        /* set up a UTF-8 pointer for traversing the string */
        utf8_ptr strp((char *)str);

        /*
         *   A positive index value is a 1-based index from the start of the
         *   string.  A negative index is from the end of the string, with -1
         *   pointing to the last character.  For reverse searches, 0 is the
         *   position past the last character.  In any case, adjust to a
         *   zero-based index.
         */
        start_idx += (start_idx == 0 && dir < 0 ? (int)strp.len(len) :
                      start_idx < 0 ? (int)strp.len(len) :
                      -1);

        /* if there's a substring, we can limit the skip */
        size_t min_len = (dir > 0 && str2 != 0 ? vmb_get_len(str2) : 0);

        /* skip that many characters */
        int32_t i;
        for (i = 0 ; i < start_idx && len > min_len ; ++i, strp.inc(&len)) ;

        /* 
         *   if the start index was past the end of the string (or past the
         *   point where the remaining subject string is too short for the
         *   target string), we definitely can't match 
         */
        if (i < start_idx)
        {
            retval->set_nil();
            goto done;
        }

        /* start the search here */
        str = strp.getptr();
    }
    else if (dir < 0)
    {
        /* 
         *   we're searching backwards, and there's no starting index, so the
         *   starting point is the end of the string 
         */
        str = str + len;
        start_idx = utf8_ptr::s_len(basestr, len);
        len = 0;
    }

    /* find the substring */
    int match_idx, match_len;
    if (dir > 0
        ? find_substr(vmg_ self_val, basestr, str, len, str2, pat2,
                      &match_idx, &match_len) != 0
        : find_last_substr(vmg_ self_val, basestr, str, len, str2, pat2,
                           &match_idx, &match_len) != 0)
    {
        /* found it - adjust to a 1-based value for return */
        retval->set_int(start_idx + match_idx + 1);
    }
    else
    {
        /* didn't find it - return nil */
        retval->set_nil();
    }

done:
    /* discard arguments */
    G_stk->discard(orig_argc);

    /* handled */
    return TRUE;
}